

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabArrayBase.cpp
# Opt level: O3

void __thiscall
amrex::FabArrayBase::define
          (FabArrayBase *this,BoxArray *bxs,DistributionMapping *dm,int nvar,IntVect *ngrow)

{
  pointer piVar1;
  vector<int,_std::allocator<int>_> *__x;
  vector<bool,_std::allocator<bool>_> *__x_00;
  long lVar2;
  BoxArray *pBVar3;
  BoxArray *pBVar4;
  
  piVar1 = (this->indexArray).super_vector<int,_std::allocator<int>_>.
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  if ((this->indexArray).super_vector<int,_std::allocator<int>_>.
      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish !=
      piVar1) {
    (this->indexArray).super_vector<int,_std::allocator<int>_>.
    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish = piVar1
    ;
  }
  (this->ownership).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_p =
       (this->ownership).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
       ._M_start.super__Bit_iterator_base._M_p;
  (this->ownership).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_offset = 0;
  *(undefined8 *)(this->n_grow).vect = *(undefined8 *)ngrow->vect;
  (this->n_grow).vect[2] = ngrow->vect[2];
  this->n_comp = nvar;
  (this->n_filled).vect[0] = 0;
  (this->n_filled).vect[1] = 0;
  (this->n_filled).vect[2] = 0;
  pBVar3 = bxs;
  pBVar4 = &this->boxarray;
  for (lVar2 = 9; lVar2 != 0; lVar2 = lVar2 + -1) {
    *(undefined8 *)&pBVar4->m_bat = *(undefined8 *)&pBVar3->m_bat;
    pBVar3 = (BoxArray *)&(pBVar3->m_bat).m_op.m_bndryReg.m_typ;
    pBVar4 = (BoxArray *)&(pBVar4->m_bat).m_op.m_bndryReg.m_typ;
  }
  (this->boxarray).m_ref.super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (bxs->m_ref).super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->boxarray).m_ref.super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,
             &(bxs->m_ref).super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  (this->boxarray).m_simplified_list.super___shared_ptr<amrex::BoxList,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (bxs->m_simplified_list).super___shared_ptr<amrex::BoxList,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->boxarray).m_simplified_list.
              super___shared_ptr<amrex::BoxList,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             &(bxs->m_simplified_list).
              super___shared_ptr<amrex::BoxList,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  (this->distributionMap).m_ref.
  super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (dm->m_ref).super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->distributionMap).m_ref.
              super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,
             &(dm->m_ref).
              super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  __x = &DistributionMapping::getIndexArray(&this->distributionMap)->
         super_vector<int,_std::allocator<int>_>;
  std::vector<int,_std::allocator<int>_>::operator=
            (&(this->indexArray).super_vector<int,_std::allocator<int>_>,__x);
  __x_00 = DistributionMapping::getOwnerShip(&this->distributionMap);
  std::vector<bool,_std::allocator<bool>_>::operator=(&this->ownership,__x_00);
  return;
}

Assistant:

void
FabArrayBase::define (const BoxArray&            bxs,
                      const DistributionMapping& dm,
                      int                        nvar,
                      const IntVect&             ngrow)
{
    BL_ASSERT(ngrow.allGE(IntVect::TheZeroVector()));
    BL_ASSERT(boxarray.size() == 0);
    indexArray.clear();
    ownership.clear();
    n_grow = ngrow;
    n_comp = nvar;
    n_filled = IntVect(0);

    boxarray = bxs;

    BL_ASSERT(dm.ProcessorMap().size() == bxs.size());
    distributionMap = dm;

    indexArray = distributionMap.getIndexArray();
    ownership = distributionMap.getOwnerShip();
}